

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.h
# Opt level: O2

bool __thiscall Js::ParseableFunctionInfo::IsFunctionParsed(ParseableFunctionInfo *this)

{
  BOOL BVar1;
  
  BVar1 = FunctionProxy::IsDeferredParseFunction(&this->super_FunctionProxy);
  return (bool)((byte)((*(ushort *)&(this->super_FunctionProxy).field_0x45 & 2) >> 1) | BVar1 == 0);
}

Assistant:

bool IsFunctionParsed()
        {
            return !IsDeferredParseFunction() || m_hasBeenParsed;
        }